

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::ipc::ClientImpl::OnDisconnect(ClientImpl *this)

{
  UnixSocket *in_RSI;
  
  OnDisconnect((ClientImpl *)
               &this[-1].weak_ptr_factory_.weak_ptr_.handle_.
                super___shared_ptr<perfetto::ipc::Client_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               in_RSI);
  return;
}

Assistant:

void ClientImpl::OnDisconnect(base::UnixSocket*) {
  for (const auto& it : service_bindings_) {
    base::WeakPtr<ServiceProxy> service_proxy = it.second;
    task_runner_->PostTask([service_proxy] {
      if (service_proxy)
        service_proxy->OnDisconnect();
    });
  }
  service_bindings_.clear();
  queued_bindings_.clear();
}